

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Derive.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Derive::ArchiveIN(ChFunction_Derive *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Derive>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_38._value = &this->fa;
  local_38._name = "fa";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->order;
  local_38._name = "order";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Derive::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Derive>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(fa);
    marchive >> CHNVP(order);
}